

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_C_upper.c
# Opt level: O2

void test_option_C_upper(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\x10',"file",L'Ƥ',L'\xffffffff',(void *)0x0);
  wVar1 = systemf("echo file | %s -o > small.cpio 2>small.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\x14',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
             ,L'\x15',"1 block\n","small.err");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\x16',"small.cpio",0x200);
  wVar1 = systemf("echo file | %s -o -C 513 > 513.cpio 2>513.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\x1b',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
             ,L'\x1c',"1 block\n","513.err");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\x1d',"513.cpio",0x201);
  wVar1 = systemf("echo file | %s -o -C12345 > 12345.cpio 2>12345.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'\"',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
             ,L'#',"1 block\n","12345.err");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                      ,L'$',"12345.cpio",0x3039);
  wVar1 = systemf("echo file | %s -o -C > bad.cpio 2>bad.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
                   ,L'(',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"echo file | %s -o -C > bad.cpio 2>bad.err\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_C_upper.c"
             ,L')',"bad.cpio");
  return;
}

Assistant:

DEFINE_TEST(test_option_C_upper)
{
	int r;

	/*
	 * Create a file on disk.
	 */
	assertMakeFile("file", 0644, NULL);

	/* Create an archive without -C; this should be 512 bytes. */
	r = systemf("echo file | %s -o > small.cpio 2>small.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "small.err");
	assertFileSize("small.cpio", 512);

	/* Create an archive with -C 513; this should be 513 bytes. */
	r = systemf("echo file | %s -o -C 513 > 513.cpio 2>513.err",
		    testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "513.err");
	assertFileSize("513.cpio", 513);

	/* Create an archive with -C 12345; this should be 12345 bytes. */
	r = systemf("echo file | %s -o -C12345 > 12345.cpio 2>12345.err",
		    testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "12345.err");
	assertFileSize("12345.cpio", 12345);

	/* Create an archive with invalid -C request */
	assert(0 != systemf("echo file | %s -o -C > bad.cpio 2>bad.err",
			    testprog));
	assertEmptyFile("bad.cpio");
}